

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S2Test.cpp
# Opt level: O3

void __thiscall RandomS2IsInM::test_method(RandomS2IsInM *this)

{
  undefined **ppuVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  S2 S;
  Point y;
  shared_count sStack_278;
  char *local_270;
  char *local_268;
  undefined **local_260;
  undefined1 local_258;
  undefined7 uStack_257;
  undefined8 *local_250;
  char **local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  S2 local_1e0 [144];
  void *local_150;
  ConstSubPoint local_140 [272];
  
  mnf::S2::S2(local_1e0);
  mnf::Manifold::createRandomPoint(1.0);
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0x4e);
  mnf::Point::isInM(1e-12);
  sStack_278.pi_ = (sp_counted_base *)0x0;
  local_270 = "y.isInM()";
  local_268 = "";
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_00124c88;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_208 = "";
  local_248 = &local_270;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_278);
  lVar3 = mnf::Manifold::representationDim();
  if (lVar3 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_random_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  mnf::SubPoint::value();
  ppuVar1 = local_260;
  if (CONCAT71(uStack_257,local_258) == lVar3) {
    if (lVar3 != 0) {
      lVar4 = 0;
      do {
        iVar2 = rand();
        ppuVar1[lVar4] = (undefined *)(((double)iVar2 + (double)iVar2) / 2147483647.0 + -1.0);
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
    }
    local_220 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
    ;
    local_218 = "";
    local_230 = &boost::unit_test::basic_cstring<char_const>::null;
    local_228 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x50);
    mnf::Point::isInM(1e-12);
    sStack_278.pi_ = (sp_counted_base *)0x0;
    local_270 = "!y.isInM()";
    local_268 = "";
    local_258 = 0;
    local_260 = &PTR__lazy_ostream_00124c88;
    local_250 = &boost::unit_test::lazy_ostream::inst;
    local_240 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
    ;
    local_238 = "";
    local_248 = &local_270;
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_278);
    mnf::ConstSubPoint::~ConstSubPoint(local_140);
    free(local_150);
    mnf::Manifold::~Manifold((Manifold *)local_1e0);
    return;
  }
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                "void Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>]"
               );
}

Assistant:

BOOST_AUTO_TEST_CASE(RandomS2IsInM)
{
  S2 S;
  Point y = S.createRandomPoint();
  BOOST_CHECK(y.isInM());
  y.value() = Eigen::VectorXd::Random(S.representationDim());
  BOOST_CHECK(!y.isInM());
}